

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

StructurePtr __thiscall soul::heart::Parser::findStruct(Parser *this,string *name)

{
  long *plVar1;
  __type_conflict1 _Var2;
  Module *pMVar3;
  Structure *pSVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  StructurePtr *s;
  long lVar6;
  RefCountedPtr<soul::Structure> *this_00;
  string_view name_00;
  string local_50;
  
  pMVar3 = pool_ptr<soul::Module>::operator->((pool_ptr<soul::Module> *)&name[4]._M_string_length);
  name_00._M_str = (char *)in_RDX->_M_string_length;
  name_00._M_len = (size_t)&pMVar3->structs;
  Module::Structs::find((Structs *)this,name_00);
  if ((this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser == (_func_int **)0x0) {
    RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)this);
    lVar6 = *(long *)((long)&name[3].field_2 + 8);
    plVar1 = *(long **)(lVar6 + 0x48);
    for (plVar5 = *(long **)(lVar6 + 0x40); plVar5 != plVar1; plVar5 = plVar5 + 1) {
      this_00 = *(RefCountedPtr<soul::Structure> **)(*plVar5 + 0x368);
      for (lVar6 = *(long *)(*plVar5 + 0x370) << 3; lVar6 != 0; lVar6 = lVar6 + -8) {
        pSVar4 = RefCountedPtr<soul::Structure>::operator*(this_00);
        Program::getFullyQualifiedStructName_abi_cxx11_
                  (&local_50,(Program *)((long)&name[3].field_2 + 8),pSVar4);
        _Var2 = std::operator==(&local_50,in_RDX);
        std::__cxx11::string::~string((string *)&local_50);
        if (_Var2) {
          pSVar4 = this_00->object;
          (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser = (_func_int **)pSVar4;
          if (pSVar4 == (Structure *)0x0) {
            return (StructurePtr)(Structure *)this;
          }
          (pSVar4->super_RefCountedObject).refCount = (pSVar4->super_RefCountedObject).refCount + 1;
          return (StructurePtr)(Structure *)this;
        }
        this_00 = this_00 + 1;
      }
    }
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    )._vptr_Tokeniser = (_func_int **)0x0;
  }
  return (StructurePtr)(Structure *)this;
}

Assistant:

StructurePtr findStruct (const std::string& name)
    {
        if (auto s = module->structs.find (name))
            return s;

        for (auto& m : program.getModules())
            for (auto& s : m->structs.get())
                if (program.getFullyQualifiedStructName (*s) == name)
                    return s;

        return {};
    }